

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O3

ON_OBSOLETE_V2_DimAngular *
ON_OBSOLETE_V2_DimAngular::CreateFromV5AngularDimension
          (ON_OBSOLETE_V5_DimAngular *V5_angular_dimension,
          ON_3dmAnnotationContext *annotation_context,ON_OBSOLETE_V2_DimAngular *destination)

{
  double dVar1;
  ON_3dPoint point;
  ON_3dPoint point_00;
  ON_3dPoint point_01;
  ON_3dPoint point_02;
  ON_OBSOLETE_V2_DimAngular *this;
  ON_OBSOLETE_V2_DimAngular *extraout_RDX;
  ON_2dPoint OVar2;
  ON_SimpleArray<ON_2dPoint> V5_points;
  ON_2dPoint local_98;
  ON_3dPoint local_88;
  ON_3dPoint local_70;
  ON_3dPoint local_58;
  ON_3dPoint local_40;
  ON_SimpleArray<ON_2dPoint> local_28;
  
  this = destination;
  if (destination == (ON_OBSOLETE_V2_DimAngular *)0x0) {
    this = (ON_OBSOLETE_V2_DimAngular *)operator_new(0xd8);
    ON_OBSOLETE_V2_DimAngular(this);
    destination = extraout_RDX;
  }
  ON_OBSOLETE_V2_Annotation::Internal_InitializeFromV5Annotation
            (&this->super_ON_OBSOLETE_V2_Annotation,
             &V5_angular_dimension->super_ON_OBSOLETE_V5_Annotation,
             (ON_3dmAnnotationContext *)destination);
  local_28._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0080b170;
  local_28.m_a = (ON_2dPoint *)0x0;
  local_28.m_count = 0;
  local_28.m_capacity = 0;
  ON_SimpleArray<ON_2dPoint>::operator=
            (&local_28,
             &(V5_angular_dimension->super_ON_OBSOLETE_V5_Annotation).m_points.
              super_ON_SimpleArray<ON_2dPoint>);
  if (-1 < (this->super_ON_OBSOLETE_V2_Annotation).m_points.m_capacity) {
    (this->super_ON_OBSOLETE_V2_Annotation).m_points.m_count = 0;
  }
  OVar2 = ON_OBSOLETE_V5_Annotation::Point(&V5_angular_dimension->super_ON_OBSOLETE_V5_Annotation,1)
  ;
  local_98.y = OVar2.y;
  local_98.x = OVar2.x;
  ON_3dPoint::ON_3dPoint(&local_40,&local_98);
  point.y = local_40.y;
  point.x = local_40.x;
  point.z = local_40.z;
  ON_OBSOLETE_V2_Annotation::SetPoint(&this->super_ON_OBSOLETE_V2_Annotation,0,point);
  OVar2 = ON_OBSOLETE_V5_Annotation::Point(&V5_angular_dimension->super_ON_OBSOLETE_V5_Annotation,2)
  ;
  local_98.y = OVar2.y;
  local_98.x = OVar2.x;
  ON_3dPoint::ON_3dPoint(&local_58,&local_98);
  point_00.y = local_58.y;
  point_00.x = local_58.x;
  point_00.z = local_58.z;
  ON_OBSOLETE_V2_Annotation::SetPoint(&this->super_ON_OBSOLETE_V2_Annotation,1,point_00);
  OVar2 = ON_OBSOLETE_V5_Annotation::Point(&V5_angular_dimension->super_ON_OBSOLETE_V5_Annotation,3)
  ;
  local_98.y = OVar2.y;
  local_98.x = OVar2.x;
  ON_3dPoint::ON_3dPoint(&local_70,&local_98);
  point_01.y = local_70.y;
  point_01.x = local_70.x;
  point_01.z = local_70.z;
  ON_OBSOLETE_V2_Annotation::SetPoint(&this->super_ON_OBSOLETE_V2_Annotation,2,point_01);
  OVar2 = ON_OBSOLETE_V5_Annotation::Point(&V5_angular_dimension->super_ON_OBSOLETE_V5_Annotation,0)
  ;
  local_98.y = OVar2.y;
  local_98.x = OVar2.x;
  ON_3dPoint::ON_3dPoint(&local_88,&local_98);
  point_02.y = local_88.y;
  point_02.x = local_88.x;
  point_02.z = local_88.z;
  ON_OBSOLETE_V2_Annotation::SetPoint(&this->super_ON_OBSOLETE_V2_Annotation,3,point_02);
  dVar1 = V5_angular_dimension->m_radius;
  this->m_angle = V5_angular_dimension->m_angle;
  this->m_radius = dVar1;
  ON_SimpleArray<ON_2dPoint>::~ON_SimpleArray(&local_28);
  return this;
}

Assistant:

ON_OBSOLETE_V2_DimAngular* ON_OBSOLETE_V2_DimAngular::CreateFromV5AngularDimension(
  const class ON_OBSOLETE_V5_DimAngular& V5_angular_dimension,
  const ON_3dmAnnotationContext* annotation_context,
  ON_OBSOLETE_V2_DimAngular* destination
)
{
  ON_OBSOLETE_V2_DimAngular* V2_angular_dimension
    = (nullptr != destination)
    ? destination
    : new ON_OBSOLETE_V2_DimAngular();
  V2_angular_dimension->Internal_InitializeFromV5Annotation(V5_angular_dimension,annotation_context);
  ON_SimpleArray<ON_2dPoint> V5_points(V5_angular_dimension.m_points);
  V2_angular_dimension->m_points.SetCount(0);
  V2_angular_dimension->SetPoint(0, ON_3dPoint(V5_angular_dimension.Point(1)));
  V2_angular_dimension->SetPoint(1, ON_3dPoint(V5_angular_dimension.Point(2)));
  V2_angular_dimension->SetPoint(2, ON_3dPoint(V5_angular_dimension.Point(3)));
  V2_angular_dimension->SetPoint(3, ON_3dPoint(V5_angular_dimension.Point(0))); // text point or apex
  V2_angular_dimension->SetAngle( V5_angular_dimension.Angle());
  V2_angular_dimension->SetRadius( V5_angular_dimension.Radius());

  return V2_angular_dimension;
}